

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O0

ON__UINT32 __thiscall ON_XMLVariant::DataCRC(ON_XMLVariant *this,ON__UINT32 crc)

{
  int iVar1;
  ON__INT64 OVar2;
  ON_wString local_198 [3];
  ON_Buffer local_180;
  double local_140;
  time_t t;
  ON_UUID u;
  int iStack_11c;
  bool x_5;
  int i_3;
  int j;
  ON__INT64 x_4 [16];
  int local_90;
  int local_8c;
  int index;
  int i_2;
  ON__INT64 x_3 [4];
  int local_5c;
  int i_1;
  ON__INT64 x_2 [3];
  int i;
  ON__INT64 x_1 [2];
  int local_20;
  ON__UINT32 local_1c;
  int x;
  ON__UINT32 crc_local;
  ON_XMLVariant *this_local;
  
  local_1c = crc;
  _x = this;
  iVar1 = (*this->_vptr_ON_XMLVariant[3])();
  switch(iVar1) {
  case 1:
    u.Data4[3] = (this->_private->field_2)._bool_val & 1;
    this_local._4_4_ = ON_CRC32(local_1c,1,u.Data4 + 3);
    break;
  case 2:
    local_20 = (this->_private->field_2)._int_val;
    this_local._4_4_ = ON_CRC32(local_1c,4,&local_20);
    break;
  case 3:
    this_local._4_4_ = CRCReal<float>(local_1c,(this->_private->field_2)._float_val);
    break;
  case 4:
    this_local._4_4_ = CRCReal<double>(local_1c,(this->_private->field_2)._double_val);
    break;
  case 5:
    (*this->_vptr_ON_XMLVariant[0x2d])();
    this_local._4_4_ = ON_wString::DataCRCLower(local_198,local_1c);
    ON_wString::~ON_wString(local_198);
    break;
  case 6:
    memset(&stack0xffffffffffffffc8,0,0x10);
    for (x_2[2]._4_4_ = 0; x_2[2]._4_4_ < 2; x_2[2]._4_4_ = x_2[2]._4_4_ + 1) {
      OVar2 = Integerize(*(double *)((long)&this->_private->field_2 + (long)x_2[2]._4_4_ * 8));
      *(ON__INT64 *)(&stack0xffffffffffffffc8 + (long)x_2[2]._4_4_ * 8) = OVar2;
    }
    this_local._4_4_ = ON_CRC32(local_1c,0x10,&stack0xffffffffffffffc8);
    break;
  case 7:
    memset(&stack0xffffffffffffffa8,0,0x18);
    for (local_5c = 0; local_5c < 3; local_5c = local_5c + 1) {
      OVar2 = Integerize(*(double *)((long)&this->_private->field_2 + (long)local_5c * 8));
      *(ON__INT64 *)(&stack0xffffffffffffffa8 + (long)local_5c * 8) = OVar2;
    }
    this_local._4_4_ = ON_CRC32(local_1c,0x18,&stack0xffffffffffffffa8);
    break;
  case 8:
  case 9:
    memset(&index,0,0x20);
    for (local_8c = 0; local_8c < 4; local_8c = local_8c + 1) {
      OVar2 = Integerize(*(double *)((long)&this->_private->field_2 + (long)local_8c * 8));
      *(ON__INT64 *)(&index + (long)local_8c * 2) = OVar2;
    }
    this_local._4_4_ = ON_CRC32(local_1c,0x20,&index);
    break;
  case 10:
    local_90 = 0;
    memset(&i_3,0,0x80);
    for (iStack_11c = 0; iStack_11c < 4; iStack_11c = iStack_11c + 1) {
      u.Data4[4] = '\0';
      u.Data4[5] = '\0';
      u.Data4[6] = '\0';
      u.Data4[7] = '\0';
      for (; (int)u.Data4._4_4_ < 4; u.Data4._4_4_ = u.Data4._4_4_ + 1) {
        OVar2 = Integerize(*(double *)
                            ((long)&this->_private->field_2 +
                            (long)iStack_11c * 8 + (long)(int)u.Data4._4_4_ * 0x20));
        *(ON__INT64 *)(&i_3 + (long)local_90 * 2) = OVar2;
        local_90 = local_90 + 1;
      }
    }
    this_local._4_4_ = ON_CRC32(local_1c,0x80,&i_3);
    break;
  case 0xb:
    unique0x00012000 = (this->_private->field_2)._double_val;
    u._0_8_ = (this->_private->field_2).m_xform.m_xform[0][1];
    this_local._4_4_ = ON_CRC32(local_1c,0x10,(void *)((long)&t + 4));
    break;
  case 0xc:
    local_140 = (this->_private->field_2)._double_val;
    this_local._4_4_ = ON_CRC32(local_1c,8,&local_140);
    break;
  case 0xd:
    (*this->_vptr_ON_XMLVariant[0x2b])();
    this_local._4_4_ = ON_Buffer::CRC32(&local_180,local_1c);
    ON_Buffer::~ON_Buffer(&local_180);
    break;
  default:
    this_local._4_4_ = local_1c;
  }
  return this_local._4_4_;
}

Assistant:

ON__UINT32 ON_XMLVariant::DataCRC(ON__UINT32 crc) const
{
  switch (Type())
  {
  default:
    return crc;

  case Types::Double:
    return CRCReal(crc, _private->_double_val);

  case Types::Float:
    return CRCReal(crc, _private->_float_val);

  case Types::Integer:
  {
    const auto x = _private->_int_val;
    return ON_CRC32(crc, sizeof(x), &x);
  }

  case Types::DoubleArray2:
  {
    ON__INT64 x[2] = { 0 };
    for (int i = 0; i < 2; i++) x[i] = Integerize(_private->_array_val[i]);
    return ON_CRC32(crc, sizeof(x), &x);
  }

  case Types::DoubleArray3:
  {
    ON__INT64 x[3] = { 0 };
    for (int i = 0; i < 3; i++) x[i] = Integerize(_private->_array_val[i]);
    return ON_CRC32(crc, sizeof(x), &x);
  }

  case Types::DoubleArray4:
  case Types::DoubleColor4:
  {
    ON__INT64 x[4] = { 0 };
    for (int i = 0; i < 4; i++) x[i] = Integerize(_private->_array_val[i]);
    return ON_CRC32(crc, sizeof(x), &x);
  }

  case Types::Matrix:
  {
    int index = 0;
    ON__INT64 x[16] = { 0 };
    for (int j = 0; j < 4; j++)
      for (int i = 0; i < 4; i++)
        x[index++] = Integerize(_private->m_xform.m_xform[i][j]);
    return ON_CRC32(crc, sizeof(x), &x);
  }

  case Types::Bool:
  {
    const auto x = _private->_bool_val;
    return ON_CRC32(crc, sizeof(x), &x);
  }

  case Types::Uuid:
  {
    const auto u = _private->_uuid_val;
    return ON_CRC32(crc, sizeof(u), &u);
  }

  case Types::Time:
  {
    const auto t = _private->_time_val;
    return ON_CRC32(crc, sizeof(t), &t);
  }

  case Types::Buffer:
  {
    return AsBuffer().CRC32(crc);
  }

  case Types::String:
    return AsString().DataCRCLower(crc);
  }
}